

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,bool isCollecting)

{
  code *pcVar1;
  anon_class_24_3_3b104623 fn;
  Type TVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  BVIndex BVar6;
  uint uVar7;
  SmallHeapBlockBitVector *pSVar8;
  undefined4 *puVar9;
  FreeObject *this_00;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  undefined7 in_register_00000031;
  BVIndex BVar10;
  undefined1 auStack_88 [8];
  SmallHeapBlockBitVector temp;
  SmallHeapBlockBitVector *local_50;
  SmallHeapBlockBitVector *free;
  SmallHeapBlockBitVector *local_40;
  uint local_34 [2];
  uint verifyFreeCount;
  
  if (((int)CONCAT71(in_register_00000031,isCollecting) == 0) &&
     ((*(this->super_HeapBlock)._vptr_HeapBlock[0x10])(this),
     auStack_88 != (undefined1  [8])this->freeObjectList)) {
    CheckDebugFreeBitVector(this,false);
    return;
  }
  local_50 = &this->freeBits;
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  auStack_88 = (undefined1  [8])0x0;
  temp.data[0].word = 0;
  local_40 = local_50;
  BVStatic<256UL>::Copy((BVStatic<256UL> *)auStack_88,local_50);
  pSVar8 = GetInvalidBitVector(this);
  BVStatic<256UL>::And((BVStatic<256UL> *)auStack_88,pSVar8);
  bVar3 = BVStatic<256UL>::IsAllClear((BVStatic<256UL> *)auStack_88);
  if (bVar3) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x71d,"(temp.IsAllClear())","temp.IsAllClear()");
    if (!bVar3) goto LAB_0062042d;
    *puVar9 = 0;
  }
  local_34[0] = 0;
  BVar10 = 0;
  free = (SmallHeapBlockBitVector *)this;
  for (this_00 = this->freeObjectList; this_00 != (FreeObject *)0x0;
      this_00 = FreeObject::GetNext(this_00)) {
    uVar5 = GetAddressBitIndex(this_00);
    bVar3 = IsValidBitIndex((SmallHeapBlockT<SmallAllocationBlockAttributes> *)free,(uint)uVar5);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x724,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
      if (!bVar3) goto LAB_0062042d;
      *puVar9 = 0;
    }
    BVar4 = BVStatic<256UL>::Test(&this->debugFreeBits,(uint)uVar5);
    if (BVar4 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x725,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                         "this->GetDebugFreeBitVector()->Test(bitIndex)");
      if (!bVar3) goto LAB_0062042d;
      *puVar9 = 0;
    }
    BVar4 = BVStatic<256UL>::Test(local_40,(uint)uVar5);
    if (BVar4 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x726,"(free->Test(bitIndex))","free->Test(bitIndex)");
      if (!bVar3) goto LAB_0062042d;
      *puVar9 = 0;
    }
    BVar10 = BVar10 + 1;
    local_34[0] = BVar10;
  }
  BVar6 = BVStatic<256UL>::Count(&this->debugFreeBits);
  pSVar8 = free;
  if (BVar6 != BVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72b,"(this->GetDebugFreeBitVector()->Count() == verifyFreeCount)",
                       "this->GetDebugFreeBitVector()->Count() == verifyFreeCount");
    if (!bVar3) goto LAB_0062042d;
    *puVar9 = 0;
  }
  TVar2 = pSVar8[2].data[3].word;
  BVar6 = BVStatic<256UL>::Count(local_40);
  if (BVar6 != (ushort)TVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x72c,"(this->freeCount == this->GetFreeBitVector()->Count())",
                       "this->freeCount == this->GetFreeBitVector()->Count()");
    if (!bVar3) goto LAB_0062042d;
    *puVar9 = 0;
  }
  bVar3 = HeapBlock::IsAnyFinalizableBlock((HeapBlock *)pSVar8);
  if (bVar3) {
    this_01 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>((HeapBlock *)pSVar8);
    temp.data[3].word = (Type)pSVar8;
    fn.free = &local_50;
    fn.this = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)pSVar8;
    fn.verifyFreeCount = local_34;
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckFreeBitVector(bool)::_lambda(unsigned_int)_1_>
              (this_01,fn);
    uVar7 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
            CheckDisposedObjectFreeBitVector(this_01);
    BVar10 = uVar7 + local_34[0];
    local_34[0] = BVar10;
  }
  if (BVar10 != (ushort)pSVar8[2].data[3].word) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x73f,"(verifyFreeCount == this->freeCount)",
                       "verifyFreeCount == this->freeCount");
    if (!bVar3) goto LAB_0062042d;
    *puVar9 = 0;
    BVar10 = local_34[0];
  }
  if (*(ushort *)((long)&pSVar8[2].data[3].word + 2) < BVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x740,"(verifyFreeCount <= this->lastFreeCount)",
                       "verifyFreeCount <= this->lastFreeCount");
    if (!bVar3) goto LAB_0062042d;
    *puVar9 = 0;
  }
  if (pSVar8[1].data[1].word != pSVar8[1].data[2].word) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x741,"(this->IsFreeBitsValid())","this->IsFreeBitsValid()");
    if (!bVar3) {
LAB_0062042d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar9 = 0;
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::CheckFreeBitVector(bool isCollecting)
{
    // during collection, the heap block has the current info when we are verifying
    if (!isCollecting)
    {
        FreeObject * freeObjectList;
        this->GetFreeObjectListOnAllocator(&freeObjectList);
        if (freeObjectList != this->freeObjectList)
        {
            // allocator has the current info and if we have already allocated some memory,
            // the free bit vector isn't really correct, so we can't verify it.
            // Just verify the debug free bit vector
            this->CheckDebugFreeBitVector(false);
            return;
        }
    }

    SmallHeapBlockBitVector * free = this->GetFreeBitVector();

    // Shouldn't be any invalid bits set in the free bit vector
    SmallHeapBlockBitVector temp;
    temp.Copy(free);
    temp.And(this->GetInvalidBitVector());
    Assert(temp.IsAllClear());

    uint verifyFreeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        Assert(free->Test(bitIndex));
        verifyFreeCount++;

        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == verifyFreeCount);
    Assert(this->freeCount == this->GetFreeBitVector()->Count());

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;
        });

        // Include disposed objects
        verifyFreeCount += finalizableBlock->CheckDisposedObjectFreeBitVector();
    }

    Assert(verifyFreeCount == this->freeCount);
    Assert(verifyFreeCount <= this->lastFreeCount);
    Assert(this->IsFreeBitsValid());
}